

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O1

int __thiscall
ON_Viewport::GetBoundingBoxDepth
          (ON_Viewport *this,ON_BoundingBox bbox,ON_Xform *bbox_xform,double *near_dist,
          double *far_dist,bool bGrowNearFar)

{
  double dVar1;
  ON_3dPoint P;
  ON_3dPoint P_00;
  ON_3dVector N;
  ON_3dPoint *pOVar2;
  double dVar3;
  bool bVar4;
  byte bVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  undefined7 extraout_var;
  int iVar9;
  long lVar10;
  byte bVar11;
  long lVar12;
  ON_Viewport *this_00;
  undefined7 in_register_00000081;
  uint uVar13;
  ON_Xform *this_01;
  ON_PlaneEquation *this_02;
  int iVar14;
  ON_3dPoint *pOVar15;
  ON_Line *line;
  long lVar16;
  uint uVar17;
  uint uVar18;
  view_projection vVar19;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar20;
  double t [2];
  double Lbuffer [24];
  double Sbuffer [20];
  double v [4] [8];
  double Pbuffer [216];
  ON_Interval local_a58;
  double local_a48;
  view_projection local_a3c;
  ON_3dPoint *local_a38;
  ulong local_a30;
  undefined4 local_a24;
  ON_Xform *local_a20;
  double *local_a18;
  ON_3dPoint local_a10;
  undefined4 local_9f8;
  uint uStack_9f4;
  undefined4 uStack_9f0;
  uint uStack_9ec;
  ON_Viewport *local_9e0;
  ON_3dVector *local_9d8;
  double *local_9d0;
  undefined1 local_9c8 [16];
  double local_9b8;
  double dStack_9b0;
  double local_9a8;
  ON_3dVector local_9a0;
  ON_Line local_988;
  ON_3dPoint local_958;
  ON_3dPoint local_940;
  ON_3dPoint local_928;
  ON_3dPoint local_910;
  ON_3dPoint local_8f8;
  ON_3dPoint local_8e0;
  ON_PlaneEquation local_8c8;
  ON_PlaneEquation local_8a8;
  ON_PlaneEquation local_888;
  ON_PlaneEquation local_868;
  ON_PlaneEquation local_848;
  ON_3dPoint local_828;
  ON_3dVector local_810;
  double adStack_7f8 [8];
  double adStack_7b8 [8];
  double adStack_778 [8];
  double adStack_738 [8];
  ON_3dPoint local_6f8 [8];
  ON_3dPoint local_638;
  ON_3dPoint local_620 [63];
  
  local_a24 = (undefined4)CONCAT71(in_register_00000081,bGrowNearFar);
  local_a38 = &this->m_CamLoc;
  local_a18 = far_dist;
  local_9d0 = near_dist;
  dVar1 = ON_3dPoint::MaximumCoordinate(local_a38);
  local_9c8._8_4_ = extraout_XMM0_Dc;
  local_9c8._0_8_ = dVar1;
  local_9c8._12_4_ = extraout_XMM0_Dd;
  vVar19 = this->m_projection;
  pOVar15 = local_6f8;
  bVar4 = ON_BoundingBox::GetCorners(&bbox,pOVar15);
  if (((!bVar4) ||
      (((bbox_xform != (ON_Xform *)0x0 && (bVar4 = ON_Xform::IsValid(bbox_xform), !bVar4)) ||
       (bVar4 = GetFrustumLeftPlaneEquation(this,&local_8c8), !bVar4)))) ||
     (((bVar4 = GetFrustumRightPlaneEquation(this,&local_8a8), !bVar4 ||
       (bVar4 = GetFrustumBottomPlaneEquation(this,&local_888), !bVar4)) ||
      (bVar4 = GetFrustumTopPlaneEquation(this,&local_868), !bVar4)))) {
    iVar14 = 0;
    goto LAB_0067acd6;
  }
  local_a30 = 0;
  uVar20 = local_9c8._12_4_;
  local_9c8._8_4_ = local_9c8._8_4_;
  local_9c8._0_8_ = (local_9c8._0_8_ + 1.0) * 1.490116119385e-08;
  local_9c8._12_4_ = uVar20;
  local_9a8 = local_a38->z;
  local_9b8 = local_a38->x;
  dStack_9b0 = local_a38->y;
  local_9d8 = &this->m_CamZ;
  local_a20 = bbox_xform;
  local_9e0 = this;
  ON_3dVector::operator-(&local_810,local_9d8);
  this_01 = local_a20;
  P.y = dStack_9b0;
  P.x = local_9b8;
  P.z = local_9a8;
  N.y = local_810.y;
  N.x = local_810.x;
  N.z = local_810.z;
  ON_PlaneEquation::Create(&local_848,P,N);
  uStack_9f4 = local_9c8._4_4_ ^ 0x80000000;
  uStack_9ec = local_9c8._12_4_ ^ 0x80000000;
  uStack_9f0 = local_9c8._8_4_;
  local_9f8 = local_9c8._0_4_;
  local_a48 = -NAN;
  uVar17 = 0;
  bVar5 = 0;
  local_a3c = vVar19;
  do {
    if (this_01 != (ON_Xform *)0x0) {
      ON_Xform::operator*(&local_988.from,this_01,pOVar15);
      pOVar15->z = local_988.from.z;
      pOVar15->x = local_988.from.x;
      pOVar15->y = local_988.from.y;
    }
    dVar1 = ON_PlaneEquation::ValueAt(&local_8c8,*pOVar15);
    dVar3 = local_a48;
    bVar4 = dVar1 < (double)CONCAT44(uStack_9f4,local_9f8);
    adStack_7b8[(long)local_a48] = dVar1;
    bVar11 = !bVar4;
    uVar17 = uVar17 | bVar4;
    dVar1 = ON_PlaneEquation::ValueAt(&local_8a8,*pOVar15);
    adStack_778[(long)dVar3] = dVar1;
    uVar18 = uVar17 | 2;
    if ((double)CONCAT44(uStack_9f4,local_9f8) <= dVar1) {
      uVar18 = uVar17;
      bVar11 = bVar11 + 2;
    }
    local_a48 = dVar3;
    dVar1 = ON_PlaneEquation::ValueAt(&local_888,*pOVar15);
    adStack_738[(long)dVar3] = dVar1;
    uVar13 = uVar18 | 4;
    if ((double)CONCAT44(uStack_9f4,local_9f8) <= dVar1) {
      uVar13 = uVar18;
      bVar11 = bVar11 + 4;
    }
    dVar1 = ON_PlaneEquation::ValueAt(&local_868,*pOVar15);
    vVar19 = local_a3c;
    uVar17 = uVar13 | 8;
    if ((double)CONCAT44(uStack_9f4,local_9f8) <= dVar1) {
      uVar17 = uVar13;
      bVar11 = bVar11 + 8;
    }
    (&local_6f8[0].x)[(long)local_a48] = dVar1;
    if ((local_a3c != perspective_view) ||
       (dVar1 = ON_PlaneEquation::ValueAt(&local_848,*pOVar15), 0.0 < dVar1)) {
      bVar11 = bVar11 | 0x10;
    }
    this_00 = local_9e0;
    pOVar2 = local_a38;
    if (bVar11 == 0x1f) {
      uVar7 = local_a30 & 0xffffffff;
      local_a30 = (ulong)((int)local_a30 + 1);
      local_620[uVar7 - 1].z = pOVar15->z;
      dVar1 = pOVar15->y;
      (&local_638)[uVar7].x = pOVar15->x;
      local_620[uVar7 - 1].y = dVar1;
    }
    uVar7 = local_a30;
    bVar5 = bVar5 | bVar11;
    pOVar15 = pOVar15 + 1;
    local_a48 = (double)((long)local_a48 + 1);
    this_01 = local_a20;
  } while (local_a48 != 0.0);
  uVar18 = (uint)local_a30;
  if (uVar18 < 8) {
    iVar14 = 1;
    iVar9 = 1;
    if (bVar5 == 0x1f) {
      if (vVar19 == perspective_view) {
        dVar1 = ON_BoundingBox::MinimumDistanceTo(&bbox,local_a38);
        bVar6 = dVar1 <= 0.0;
        if (bVar6) {
          uVar8 = uVar7 & 0xffffffff;
          uVar7 = (ulong)(uVar18 + 1);
          local_620[uVar8 - 1].z = pOVar2->z;
          dVar1 = pOVar2->y;
          (&local_638)[uVar8].x = pOVar2->x;
          local_620[uVar8 - 1].y = dVar1;
        }
        local_988.from.z = pOVar2->z;
        local_988.from.x = pOVar2->x;
        local_988.from.y = pOVar2->y;
        local_958.z = pOVar2->z;
        local_958.x = pOVar2->x;
        local_958.y = pOVar2->y;
        local_928.x = pOVar2->x;
        local_928.y = pOVar2->y;
        local_928.z = pOVar2->z;
        local_8f8.x = pOVar2->x;
        local_8f8.y = pOVar2->y;
        local_8f8.z = pOVar2->z;
        this_00 = local_9e0;
      }
      else {
        bVar4 = GetNearRect(local_9e0,&local_988.from,&local_958,&local_928,&local_8f8);
        bVar6 = false;
        if (!bVar4) goto LAB_0067acd6;
      }
      bVar4 = GetFarRect(this_00,&local_988.to,&local_940,&local_910,&local_8e0);
      if (!bVar4) goto LAB_0067acd6;
      local_a20 = (ON_Xform *)CONCAT44(local_a20._4_4_,(int)CONCAT71(extraout_var,bVar4));
      lVar10 = 0;
      uVar17 = ~uVar17;
      line = &local_988;
      local_a48 = (double)CONCAT44(local_a48._4_4_,uVar17);
      do {
        if ((*(uint *)((long)&DAT_006f8380 + lVar10) & uVar17) == 0) {
          bVar4 = ON_Intersect(&bbox,line,(double)local_9c8._0_8_,&local_a58);
          if (bVar4) {
            if (vVar19 == perspective_view) {
              if (local_a58.m_t[1] < 0.0) goto LAB_0067b02f;
              if (local_a58.m_t[0] < 0.0) {
                if (!bVar6) {
                  uVar8 = uVar7 & 0xffffffff;
                  uVar7 = (ulong)((int)uVar7 + 1);
                  local_620[uVar8 - 1].z = local_a38->z;
                  dVar1 = local_a38->y;
                  (&local_638)[uVar8].x = local_a38->x;
                  local_620[uVar8 - 1].y = dVar1;
                }
                local_a58.m_t[0] = local_a58.m_t[1];
                bVar6 = true;
              }
            }
            ON_Line::PointAt(&local_a10,line,local_a58.m_t[0]);
            uVar17 = (int)uVar7 + 1;
            uVar8 = uVar7 & 0xffffffff;
            local_620[uVar8 - 1].z = local_a10.z;
            (&local_638)[uVar8].x = local_a10.x;
            local_620[uVar8 - 1].y = local_a10.y;
            if (local_a58.m_t[0] < local_a58.m_t[1]) {
              ON_Line::PointAt(&local_a10,line,local_a58.m_t[1]);
              local_620[(ulong)uVar17 - 1].z = local_a10.z;
              (&local_638)[uVar17].x = local_a10.x;
              local_620[(ulong)uVar17 - 1].y = local_a10.y;
              uVar17 = (int)uVar7 + 2;
            }
            uVar7 = (ulong)uVar17;
            vVar19 = local_a3c;
            uVar17 = local_a48._0_4_;
          }
        }
LAB_0067b02f:
        lVar10 = lVar10 + 4;
        line = line + 1;
      } while (lVar10 != 0x10);
      lVar10 = 0;
      do {
        lVar16 = 0;
        do {
          uVar17 = (&DAT_006f83a4)[lVar16 * 2];
          dVar1 = adStack_7f8[lVar10 * 8 + (ulong)(uint)(&DAT_006f83a0)[lVar16 * 2]];
          if (dVar1 * adStack_7f8[lVar10 * 8 + (ulong)uVar17] < 0.0) {
            local_a48 = dVar1 / (dVar1 - adStack_7f8[lVar10 * 8 + (ulong)uVar17]);
            ::operator*((ON_3dPoint *)&local_9a0,1.0 - local_a48,
                        local_6f8 + (uint)(&DAT_006f83a0)[lVar16 * 2]);
            ::operator*(&local_828,local_a48,local_6f8 + uVar17);
            ON_3dPoint::operator+(&local_a10,(ON_3dPoint *)&local_9a0,&local_828);
            iVar14 = (int)uVar7;
            uVar8 = uVar7 & 0xffffffff;
            local_620[uVar8 - 1].z = local_a10.z;
            (&local_638)[uVar8].x = local_a10.x;
            local_620[uVar8 - 1].y = local_a10.y;
            this_02 = &local_8c8;
            lVar12 = 0;
            local_a30 = uVar7;
            do {
              if ((lVar10 != lVar12) &&
                 (P_00.y = local_a10.y, P_00.x = local_a10.x, P_00.z = local_a10.z,
                 dVar1 = ON_PlaneEquation::ValueAt(this_02,P_00), uVar7 = local_a30,
                 dVar1 <= (double)CONCAT44(uStack_9f4,local_9f8))) goto LAB_0067b192;
              lVar12 = lVar12 + 1;
              this_02 = this_02 + 1;
            } while (lVar12 != 4);
            uVar7 = (ulong)(iVar14 + 1);
          }
LAB_0067b192:
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0xc);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      iVar14 = 1;
      bVar4 = (int)uVar7 == 0;
      iVar9 = 1;
      if (bVar4) {
        bVar4 = (bool)((byte)local_a20 & !bVar4);
        goto LAB_0067acd6;
      }
      goto LAB_0067acfe;
    }
LAB_0067adc6:
    iVar14 = iVar9;
    bVar4 = false;
  }
  else {
    local_a48 = 0.0;
    iVar9 = 0;
LAB_0067acfe:
    iVar14 = iVar9;
    ON_3dPoint::operator-(&local_9a0,local_a38,&local_638);
    local_a58.m_t[0] = ON_3dVector::operator*(&local_9a0,local_9d8);
    local_a58.m_t[1] = local_a58.m_t[0];
    if (1 < (uint)uVar7) {
      pOVar15 = local_620;
      lVar10 = (uVar7 & 0xffffffff) - 1;
      do {
        ON_3dPoint::operator-(&local_9a0,local_a38,pOVar15);
        dVar1 = ON_3dVector::operator*(&local_9a0,local_9d8);
        dVar3 = dVar1;
        if ((local_a58.m_t[0] <= dVar1) && (dVar3 = local_a58.m_t[0], local_a58.m_t[1] < dVar1)) {
          local_a58.m_t[1] = dVar1;
        }
        local_a58.m_t[0] = dVar3;
        pOVar15 = pOVar15 + 1;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
    }
    if (local_a3c == perspective_view) {
      iVar9 = iVar14;
      if (local_a58.m_t[1] < 0.0) goto LAB_0067adc6;
      if (local_a58.m_t[0] < 0.0) {
        local_a58.m_t[0] = 0.0;
      }
    }
    if ((local_9d0 != (double *)0x0) &&
       ((((char)local_a24 == '\0' || (bVar4 = ON_IsValid(*local_9d0), !bVar4)) ||
        (local_a58.m_t[0] < *local_9d0)))) {
      *local_9d0 = local_a58.m_t[0];
    }
    bVar4 = true;
    if ((local_a18 != (double *)0x0) &&
       ((((char)local_a24 == '\0' || (bVar6 = ON_IsValid(*local_a18), !bVar6)) ||
        (*local_a18 <= local_a58.m_t[1] && local_a58.m_t[1] != *local_a18)))) {
      *local_a18 = local_a58.m_t[1];
    }
  }
LAB_0067acd6:
  iVar9 = 0;
  if (bVar4 != false) {
    iVar9 = 2 - iVar14;
  }
  return iVar9;
}

Assistant:

int ON_Viewport::GetBoundingBoxDepth(       
       ON_BoundingBox bbox,
       const ON_Xform* bbox_xform,
       double* near_dist,
       double* far_dist,
       bool bGrowNearFar
       ) const
{
  // The Xbuffer[] stuff is to skip wasting time in unneeded constructors.
  // The buffers are double arrays to insure alignments are correct.
  ON_3dPoint* C;
  ON_3dPoint* P;
  ON_PlaneEquation* S;
  ON_Line* L;
  ON_3dPoint Q;
  double Pbuffer[(8+8+8+48)*(sizeof(P[0])/sizeof(double))];
  double Sbuffer[5*(sizeof(S[0])/sizeof(double))];
  double Lbuffer[4*(sizeof(L[0])/sizeof(double))];
  double d, t[2], v[4][8], v0, v1;
  const double tol = ON_SQRT_EPSILON*(1.0 + m_CamLoc.MaximumCoordinate());
  C = (ON_3dPoint*)Pbuffer;
  P = C+8;
  S = (ON_PlaneEquation*)Sbuffer;
  L = (ON_Line*)Lbuffer;
  unsigned int i, j, k, Pin, Pout, Pcount;
  bool rc;
  bool bTrimmed = false;
  const bool bPerspectiveProjection = (ON::perspective_view == m_projection);

  for (;;)
  {
    rc = bbox.GetCorners(C);
    if (!rc)
      break;
    
    if (nullptr != bbox_xform)
    {
      rc = bbox_xform->IsValid();
      if (!rc)
        break;
    }

    rc = GetFrustumLeftPlaneEquation(S[0]);
    if (!rc)
      break;
    rc = GetFrustumRightPlaneEquation(S[1]);
    if (!rc)
      break;
    rc = GetFrustumBottomPlaneEquation(S[2]);
    if (!rc)
      break;
    rc = GetFrustumTopPlaneEquation(S[3]);
    if (!rc)
      break;

    S[4].Create(m_CamLoc,-m_CamZ);
    
    Pcount = 0;
    Pin = 0;
    Pout = 0;

    for ( i = 0; i < 8; i++ )
    {
      if ( nullptr != bbox_xform )
        C[i] = (*bbox_xform)*C[i];

      k = 0;
      if ( (v[0][i] = S[0].ValueAt(C[i])) >= -tol )
        k |= 1;      
      else
        Pout |= 1;
      if ( (v[1][i] = S[1].ValueAt(C[i])) >= -tol )
        k |= 2;
      else
        Pout |= 2;
      if ( (v[2][i] = S[2].ValueAt(C[i])) >= -tol )
        k |= 4;
      else
        Pout |= 4;
      if ( (v[3][i] = S[3].ValueAt(C[i])) >= -tol )
        k |= 8;
      else
        Pout |= 8;

      if ( !bPerspectiveProjection || S[4].ValueAt(C[i]) > 0.0 )
        k |= 16;

      Pin |= k;
      if ( (1|2|4|8|16) == k )
      {
        // C[i] is inside the infinite frustum
        P[Pcount++] = C[i];
      }
    }

    if ( Pcount < 8 )
    {
      bTrimmed = true;
      // some portion of bbox is outside the infinite frustum
      if ( (1|2|4|8|16) != Pin )
      {
        // bbox does not intersect the infinite frustum.
        rc = false;
        break;
      }

      j = 0;
      if ( bPerspectiveProjection )
      {
        if ( bbox.MinimumDistanceTo(m_CamLoc) <= 0.0 )
        {
          // camera location is in the bounding box
          P[Pcount++] = m_CamLoc;
          j = 1; // j = 1 indicates m_CamLoc has been added to P[].
        }
        L[0].from = m_CamLoc;
        L[1].from = m_CamLoc;
        L[2].from = m_CamLoc;
        L[3].from = m_CamLoc;
      }
      else
      {
        rc = GetNearRect(L[0].from,L[1].from,L[2].from,L[3].from);
        if (!rc)
          break;
      }

      rc = GetFarRect(L[0].to,L[1].to,L[2].to,L[3].to);
      if (!rc)
        break;

      const unsigned int Linout[4] = {
        1|4, // intersection of left and bottom frustum sides
        2|4, // intersection of right and bottom frustum sides
        1|8, // intersection of left and top frustum sides
        2|8  // intersection of right and top frustum sides
        };

      k = Pin & Pout;
      for ( i = 0; i < 4; i++ )
      {
        // The Linout[i] == ... test is true if bbox is on both sides
        // of both planes whose intersection defines the line L[i].
        // The fast integer test helps cull unnecessary calls to
        // the expensive ON_Intersect() function.
        if (    Linout[i] == (k & Linout[i]) 
             && ON_Intersect(bbox,L[i],tol,(ON_Interval*)t) 
           )
        {
          if ( bPerspectiveProjection )
          {
            if ( t[1] < 0.0 )
              continue;
            if ( t[0] < 0.0 )
            {
              if ( 0 == j )
              {
                P[Pcount++] = m_CamLoc;
                j = 1; // j = 1 indicates m_CamLoc has been added to P[].
              }
              t[0] = t[1];
            }
          }
          P[Pcount++] = L[i].PointAt(t[0]);
          if ( t[1] > t[0] )
            P[Pcount++] = L[i].PointAt(t[1]);
        }
      }

      // intersect box edges with frustum sides
      // The 12 bbox edges have endpoints
      // C[e[*][0]] and C[E[*][1]]
      const unsigned int e[12][2] = {
        {0,1},{2,3},{4,5},{6,7},
        {0,2},{1,3},{4,6},{5,7},
        {0,4},{1,5},{2,6},{3,7}};

      for ( i = 0; i < 4; i++ )
      {
        for ( j = 0; j < 12; j++ )
        {
          v0 = v[i][e[j][0]];
          v1 = v[i][e[j][1]];
          if ( v0*v1 < 0.0 )
          {
            // this box edge crosses the frustum side plane
            d = v0/(v0-v1);
            P[Pcount++] = Q = (1.0-d)*C[e[j][0]] + d*C[e[j][1]];
            // verify that Q is in the frustum
            for ( k = 0; k < 4; k++ )
            {
              if ( i != k && S[k].ValueAt(Q) <= -tol )
              {
                // Q is not in the view frustum
                Pcount--;
                break;
              }
            }
          }
        }
      }
      if ( 0 == Pcount )
      {
        rc = false;
        break;
      }
    }

    t[0] = t[1] = (m_CamLoc - P[0])*m_CamZ;
    for ( i = 1; i < Pcount; i++ )
    {
      d = (m_CamLoc - P[i])*m_CamZ;
      if ( d < t[0] )
        t[0] = d;
      else if ( d > t[1] )
        t[1] = d;
    }

    if ( bPerspectiveProjection )
    {
      if ( t[1] < 0.0 )
      {
        rc = false;
        break;
      }
      if ( t[0] < 0.0 )
        t[0] = 0.0;
    }

    if ( 0 != near_dist && (!bGrowNearFar || !ON_IsValid(*near_dist) || t[0] < *near_dist) )
      *near_dist = t[0];
    if ( 0 != far_dist && (!bGrowNearFar || !ON_IsValid(*far_dist) || t[1] > *far_dist) )
      *far_dist = t[1];

    rc = true;
    break;
  }

  // 0 = out, 1 = partially in infinite frustum, 2 = all in infinite frustum
  return (rc) ? (bTrimmed ? 1 : 2) : 0;
}